

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite22_Test::TestBody
          (LiteBasicTest_AllLite22_Test *this)

{
  undefined1 local_268 [8];
  TestMapLite message;
  LiteBasicTest_AllLite22_Test *this_local;
  
  message.field_0._576_8_ = this;
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)local_268);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>((TestMapLite *)local_268);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>((TestMapLite *)local_268);
  proto2_unittest::TestMapLite::Swap((TestMapLite *)local_268,(TestMapLite *)local_268);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>((TestMapLite *)local_268);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)local_268);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite22) {
  {
    // SwapWithSelf
    proto2_unittest::TestMapLite message;

    MapTestUtil::SetMapFields(&message);
    MapTestUtil::ExpectMapFieldsSet(message);

    message.Swap(&message);
    MapTestUtil::ExpectMapFieldsSet(message);
  }
}